

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_opt_n(void *ctx,char *next)

{
  int iVar1;
  char *pcVar2;
  RK_S32 RVar3;
  undefined8 uVar4;
  
  if (next == (char *)0x0) {
    pcVar2 = "invalid frame number\n";
    RVar3 = 0;
    uVar4 = 2;
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x220) = iVar1;
    RVar3 = 1;
    if (-1 < iVar1) {
      return 1;
    }
    pcVar2 = "infinite loop decoding mode\n";
    uVar4 = 4;
  }
  _mpp_log_l(uVar4,"mpi_dec_utils",pcVar2,0);
  return RVar3;
}

Assistant:

RK_S32 mpi_dec_opt_n(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        cmd->frame_num = atoi(next);

        if (cmd->frame_num < 0)
            mpp_log("infinite loop decoding mode\n");

        return 1;
    }

    mpp_err("invalid frame number\n");
    return 0;
}